

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O1

int dlep_reader_heartbeat_tlv(uint64_t *interval,dlep_session *session,dlep_parser_value *value)

{
  uint uVar1;
  
  if ((value == (dlep_parser_value *)0x0) &&
     (value = dlep_session_get_tlv_value(session,5), value == (dlep_parser_value *)0x0)) {
    return -1;
  }
  uVar1 = *(uint *)((session->parser).tlv_ptr + value->index);
  *interval = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                     uVar1 << 0x18);
  return 0;
}

Assistant:

int
dlep_reader_heartbeat_tlv(uint64_t *interval, struct dlep_session *session, struct dlep_parser_value *value) {
  uint32_t tmp;
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_HEARTBEAT_INTERVAL_TLV);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  memcpy(&tmp, ptr, sizeof(tmp));
  *interval = ntohl(tmp);
  return 0;
}